

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_ProStringList>_>::Data
          (Data<QHashPrivate::Node<QString,_ProStringList>_> *this,size_t reserve)

{
  long lVar1;
  size_t sVar2;
  R RVar3;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = 0;
  this->numBuckets = 0;
  this->seed = 0;
  this->spans = (Span *)0x0;
  sVar2 = 0x80;
  if (0x40 < reserve) {
    if (reserve >> 0x3e == 0) {
      lVar1 = 0x3f;
      if (reserve != 0) {
        for (; reserve >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar2 = 1L << (0x41 - ((byte)lVar1 ^ 0x3f) & 0x3f);
    }
    else {
      sVar2 = 0xffffffffffffffff;
    }
  }
  this->numBuckets = sVar2;
  RVar3 = allocateSpans(sVar2);
  this->spans = (Span *)RVar3.spans;
  sVar2 = QHashSeed::globalSeed();
  this->seed = sVar2;
  return;
}

Assistant:

Data(size_t reserve = 0)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(reserve);
        spans = allocateSpans(numBuckets).spans;
        seed = QHashSeed::globalSeed();
    }